

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

void __thiscall
duckdb::Serializer::WriteValue<std::__cxx11::string,std::__cxx11::string>
          (Serializer *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *pair)

{
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  Serializer *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  field_id_t field_id;
  
  pbVar1 = in_RDI;
  (**(code **)(*(long *)in_RDI + 0x30))();
  field_id = (field_id_t)((ulong)pbVar1 >> 0x30);
  WriteProperty<std::__cxx11::string>(unaff_retaddr,field_id,in_RSI,in_RDI);
  WriteProperty<std::__cxx11::string>(unaff_retaddr,field_id,in_RSI,in_RDI);
  (**(code **)(*(long *)in_RDI + 0x38))();
  return;
}

Assistant:

void WriteValue(const std::pair<K, V> &pair) {
		OnObjectBegin();
		WriteProperty(0, "first", pair.first);
		WriteProperty(1, "second", pair.second);
		OnObjectEnd();
	}